

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

bool P_MoveThing(AActor *source,DVector3 *pos,bool fog)

{
  double dVar1;
  AActor *pAVar2;
  double x;
  double y;
  bool bVar3;
  int iVar4;
  DVector3 local_38;
  
  x = (source->__Pos).X;
  y = (source->__Pos).Y;
  dVar1 = (source->__Pos).Z;
  local_38.X = x;
  local_38.Y = y;
  local_38.Z = dVar1;
  AActor::SetOrigin(source,pos->X,pos->Y,pos->Z,true);
  bVar3 = P_TestMobjLocation(source);
  if (bVar3) {
    if (fog) {
      P_SpawnTeleportFog(source,pos,false,true);
      P_SpawnTeleportFog(source,&local_38,true,true);
    }
    (source->Prev).Z = (source->__Pos).Z;
    dVar1 = (source->__Pos).Y;
    (source->Prev).X = (source->__Pos).X;
    (source->Prev).Y = dVar1;
    (source->PrevAngles).Roll.Degrees = (source->Angles).Roll.Degrees;
    dVar1 = (source->Angles).Yaw.Degrees;
    (source->PrevAngles).Pitch.Degrees = (source->Angles).Pitch.Degrees;
    (source->PrevAngles).Yaw.Degrees = dVar1;
    if (source->Sector == (sector_t *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = source->Sector->PortalGroup;
    }
    source->PrevPortalGroup = iVar4;
    pAVar2 = (AActor *)(&DAT_017e1fb8)[(long)consoleplayer * 0x54];
    if (pAVar2 != (AActor *)0x0) {
      if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        if (pAVar2 == source) {
          R_ResetViewInterpolation();
        }
      }
      else {
        (&DAT_017e1fb8)[(long)consoleplayer * 0x54] = 0;
      }
    }
  }
  else {
    AActor::SetOrigin(source,x,y,dVar1,true);
  }
  return bVar3;
}

Assistant:

bool P_MoveThing(AActor *source, const DVector3 &pos, bool fog)
{
	DVector3 old = source->Pos();

	source->SetOrigin (pos, true);
	if (P_TestMobjLocation (source))
	{
		if (fog)
		{
			P_SpawnTeleportFog(source, pos, false, true);
			P_SpawnTeleportFog(source, old, true, true);
		}
		source->ClearInterpolation();
		if (source == players[consoleplayer].camera)
		{
			R_ResetViewInterpolation();
		}
		return true;
	}
	else
	{
		source->SetOrigin (old, true);
		return false;
	}
}